

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

uint64_t __thiscall BuildLog::LogEntry::HashCommand(LogEntry *this,StringPiece command)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  
  pcVar3 = command.str_;
  uVar1 = (long)pcVar3 * -0x395b586ca42e166b ^ 0xdecafbaddecafbad;
  do {
    switch(pcVar3) {
    case (char *)0x7:
      uVar1 = uVar1 ^ (ulong)*(byte *)((long)&(this->output)._M_dataplus._M_p + 6) << 0x30;
    case (char *)0x6:
      uVar1 = uVar1 ^ (ulong)*(byte *)((long)&(this->output)._M_dataplus._M_p + 5) << 0x28;
    case (char *)0x5:
      uVar1 = uVar1 ^ (ulong)*(byte *)((long)&(this->output)._M_dataplus._M_p + 4) << 0x20;
    case (char *)0x4:
      uVar1 = uVar1 ^ (ulong)*(byte *)((long)&(this->output)._M_dataplus._M_p + 3) << 0x18;
    case (char *)0x3:
      uVar1 = uVar1 ^ (ulong)*(byte *)((long)&(this->output)._M_dataplus._M_p + 2) << 0x10;
    case (char *)0x2:
      uVar1 = uVar1 ^ (ulong)*(byte *)((long)&(this->output)._M_dataplus._M_p + 1) << 8;
    case (char *)0x1:
      uVar1 = (*(byte *)&(this->output)._M_dataplus._M_p ^ uVar1) * -0x395b586ca42e166b;
    case (char *)0x0:
      uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x395b586ca42e166b;
      return uVar1 >> 0x2f ^ uVar1;
    default:
      uVar2 = (long)(this->output)._M_dataplus._M_p * -0x395b586ca42e166b;
      uVar1 = ((uVar2 >> 0x2f ^ uVar2) * -0x395b586ca42e166b ^ uVar1) * -0x395b586ca42e166b;
      this = (LogEntry *)&(this->output)._M_string_length;
      pcVar3 = pcVar3 + -8;
    }
  } while( true );
}

Assistant:

uint64_t BuildLog::LogEntry::HashCommand(StringPiece command) {
  return MurmurHash64A(command.str_, command.len_);
}